

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_name.h
# Opt level: O0

string * beast::type_name<std::invalid_argument>(void)

{
  bool bVar1;
  char *pcVar2;
  pointer __p;
  string *in_RDI;
  char *local_58;
  allocator local_2a;
  undefined1 local_29;
  _func_void_void_ptr *local_28;
  undefined1 local_20 [8];
  unique_ptr<char,_void_(*)(void_*)> own;
  string *r;
  
  pcVar2 = std::type_info::name((type_info *)&std::invalid_argument::typeinfo);
  __p = (pointer)__cxa_demangle(pcVar2,0,0);
  local_28 = free;
  std::unique_ptr<char,void(*)(void*)>::unique_ptr<void(*)(void*),void>
            ((unique_ptr<char,void(*)(void*)> *)local_20,__p,&local_28);
  local_29 = 0;
  bVar1 = std::operator!=((unique_ptr<char,_void_(*)(void_*)> *)local_20,(nullptr_t)0x0);
  if (bVar1) {
    local_58 = std::unique_ptr<char,_void_(*)(void_*)>::get
                         ((unique_ptr<char,_void_(*)(void_*)> *)local_20);
  }
  else {
    local_58 = std::type_info::name((type_info *)&std::invalid_argument::typeinfo);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,local_58,&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  local_29 = 1;
  std::unique_ptr<char,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<char,_void_(*)(void_*)> *)local_20);
  return in_RDI;
}

Assistant:

std::string
type_name()
{
    using TR = typename std::remove_reference<T>::type;
    std::unique_ptr<char, void(*)(void*)> own (
    #ifndef _MSC_VER
        abi::__cxa_demangle (typeid(TR).name(), nullptr,
            nullptr, nullptr),
    #else
            nullptr,
    #endif
            std::free
    );
    std::string r = own != nullptr ? own.get() : typeid(TR).name();
    if (std::is_const<TR>::value)
        r += " const";
    if (std::is_volatile<TR>::value)
        r += " volatile";
    if (std::is_lvalue_reference<T>::value)
        r += "&";
    else if (std::is_rvalue_reference<T>::value)
        r += "&&";
    return r;
}